

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

void secp256k1_selftest(void)

{
  uchar *puVar1;
  uchar uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uchar *p1;
  uchar *data;
  char *pcVar6;
  bool bVar7;
  uchar out [32];
  uchar local_98 [32];
  secp256k1_sha256 local_78;
  
  data = local_98;
  local_78.s[0] = 0x6a09e667;
  local_78.s[1] = 0xbb67ae85;
  local_78.s[2] = 0x3c6ef372;
  local_78.s[3] = 0xa54ff53a;
  local_78.s[4] = 0x510e527f;
  local_78.s[5] = 0x9b05688c;
  local_78.s[6] = 0x1f83d9ab;
  local_78.s[7] = 0x5be0cd19;
  local_78.bytes = 0;
  secp256k1_sha256_write
            (&local_78,(uchar *)"For this sample, this 63-byte string will be used as input data",
             0x3f);
  secp256k1_sha256_finalize(&local_78,local_98);
  lVar5 = 0;
  do {
    puVar1 = local_98 + lVar5;
    uVar2 = (&secp256k1_selftest_sha256_output32)[lVar5];
    data = (uchar *)CONCAT71((int7)((ulong)data >> 8),uVar2);
    if (*puVar1 != uVar2) break;
    bVar7 = lVar5 != 0x1f;
    lVar5 = lVar5 + 1;
  } while (bVar7);
  if (*puVar1 == uVar2) {
    return;
  }
  pcVar6 = "self test failed";
  secp256k1_default_error_callback_fn("self test failed",data);
  if ((char)pcVar6 == '\x01') {
    uVar3 = (ulong)((long)pcVar6 << 3) >> 0x33;
    uVar4 = (((long)pcVar6 << 3 | (ulong)pcVar6 >> 0x3d) << 0xd | uVar3) >> 3;
    uVar3 = (uVar3 << 0x3d | uVar4) >> 0xd;
    pcVar6 = (char *)(uVar4 << 0x33 | uVar3);
    if (((uint)uVar3 >> 10 & 1) == 0) {
      return;
    }
  }
  else {
    secp256k1_context_preallocated_size_cold_1();
  }
  secp256k1_context_preallocated_size_cold_2();
  if (*(int *)pcVar6 != 0) {
    return;
  }
  secp256k1_context_preallocated_clone_size_cold_1();
  return;
}

Assistant:

void secp256k1_selftest(void) {
    if (!secp256k1_selftest_passes()) {
        secp256k1_callback_call(&default_error_callback, "self test failed");
    }
}